

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O3

double __thiscall HinOut::getdiff(HinOut *this,double v1,double v2)

{
  double dVar1;
  double dVar2;
  
  dVar2 = ABS(v1);
  dVar1 = 1.0;
  if ((1.0 < dVar2) && (dVar1 = ABS(v2), ABS(v2) <= dVar2)) {
    dVar1 = dVar2;
  }
  dVar1 = ABS(v1 - v2) / dVar1;
  return (double)(-(ulong)(1e-08 < dVar1) & (ulong)dVar1);
}

Assistant:

double HinOut::getdiff(double v1,double v2) {
	double mx = 1;
	if (abs(v1) > 1)
		mx = max(abs(v1),abs(v2));

	double val = abs(v1-v2)/mx;
	if (val > 0.00000001)
		return	val;

	return 0;
}